

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall fmt::v8::format_int::format_signed<long>(format_int *this,long value)

{
  bool bVar1;
  ulong uVar2;
  uint32_or_64_or_128_t<long> abs_value;
  char *pcVar3;
  ulong uVar4;
  
  uVar2 = -value;
  if (0 < value) {
    uVar2 = value;
  }
  pcVar3 = this->buffer_ + 0x15;
  uVar4 = uVar2;
  if (99 < uVar2) {
    do {
      uVar2 = uVar4 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar4 % 100) * 2);
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar4;
      uVar4 = uVar2;
    } while (bVar1);
  }
  if (uVar2 < 10) {
    pcVar3[-1] = (byte)uVar2 | 0x30;
    pcVar3 = pcVar3 + -1;
  }
  else {
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar2 * 2);
    pcVar3 = pcVar3 + -2;
  }
  if (value < 0) {
    pcVar3[-1] = '-';
    pcVar3 = pcVar3 + -1;
  }
  return pcVar3;
}

Assistant:

auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }